

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument.cpp
# Opt level: O3

void __thiscall sf2cute::SFInstrument::AddZone(SFInstrument *this,SFInstrumentZone *zone)

{
  int iVar1;
  SoundFont *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer puVar3;
  pointer puVar4;
  int iVar5;
  SFInstrument *pSVar6;
  invalid_argument *this_01;
  pointer *__ptr;
  bool bVar7;
  __uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
  local_28;
  shared_ptr<sf2cute::SFSample> local_20;
  
  if (zone->parent_instrument_ == (SFInstrument *)0x0) {
    SFInstrumentZone::set_parent_instrument(zone,this);
    this_00 = this->parent_file_;
    if (((this_00 != (SoundFont *)0x0) &&
        (p_Var2 = (zone->sample_).super___weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi, p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0))
       && (p_Var2->_M_use_count != 0)) {
      iVar5 = p_Var2->_M_use_count;
      do {
        if (iVar5 == 0) {
          local_20.super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          goto LAB_0010c1e9;
        }
        LOCK();
        iVar1 = p_Var2->_M_use_count;
        bVar7 = iVar5 == iVar1;
        if (bVar7) {
          p_Var2->_M_use_count = iVar5 + 1;
          iVar1 = iVar5;
        }
        iVar5 = iVar1;
        UNLOCK();
      } while (!bVar7);
      local_20.super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           p_Var2;
      if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
         (p_Var2->_M_use_count == 0)) {
LAB_0010c1e9:
        local_20.super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
      }
      else {
        local_20.super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (zone->sample_).super___weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      SoundFont::AddSample(this_00,&local_20);
      if (local_20.super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_20.super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    local_28._M_t.
    super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
    .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl =
         (tuple<sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>)
         operator_new(0x50);
    puVar3 = (zone->super_SFZone).generators_.
             super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)local_28._M_t.
            super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
            .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl + 8) =
         (zone->super_SFZone).generators_.
         super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)local_28._M_t.
            super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
            .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl + 0x10) = puVar3
    ;
    *(pointer *)
     ((long)local_28._M_t.
            super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
            .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl + 0x18) =
         (zone->super_SFZone).generators_.
         super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (zone->super_SFZone).generators_.
    super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (zone->super_SFZone).generators_.
    super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (zone->super_SFZone).generators_.
    super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    puVar4 = (zone->super_SFZone).modulators_.
             super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)local_28._M_t.
            super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
            .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl + 0x20) =
         (zone->super_SFZone).modulators_.
         super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)local_28._M_t.
            super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
            .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl + 0x28) = puVar4
    ;
    *(pointer *)
     ((long)local_28._M_t.
            super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
            .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl + 0x30) =
         (zone->super_SFZone).modulators_.
         super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (zone->super_SFZone).modulators_.
    super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (zone->super_SFZone).modulators_.
    super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (zone->super_SFZone).modulators_.
    super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined ***)
     local_28._M_t.
     super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
     .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl =
         &PTR__SFInstrumentZone_0011e7c8;
    p_Var2 = (zone->sample_).super___weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    *(element_type **)
     ((long)local_28._M_t.
            super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
            .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl + 0x38) =
         (zone->sample_).super___weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
     ((long)local_28._M_t.
            super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
            .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl + 0x40) = p_Var2
    ;
    (zone->sample_).super___weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (zone->sample_).super___weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(SFInstrument **)
     ((long)local_28._M_t.
            super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
            .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl + 0x48) =
         zone->parent_instrument_;
    std::
    vector<std::unique_ptr<sf2cute::SFInstrumentZone,std::default_delete<sf2cute::SFInstrumentZone>>,std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,std::default_delete<sf2cute::SFInstrumentZone>>>>
    ::
    emplace_back<std::unique_ptr<sf2cute::SFInstrumentZone,std::default_delete<sf2cute::SFInstrumentZone>>>
              ((vector<std::unique_ptr<sf2cute::SFInstrumentZone,std::default_delete<sf2cute::SFInstrumentZone>>,std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,std::default_delete<sf2cute::SFInstrumentZone>>>>
                *)&this->zones_,
               (unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
                *)&local_28);
    if ((_Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
         )local_28._M_t.
          super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
          .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl !=
        (SFInstrumentZone *)0x0) {
      (**(code **)(*(long *)local_28._M_t.
                            super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
                            .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl
                  + 8))();
    }
  }
  else {
    pSVar6 = SFInstrumentZone::parent_instrument(zone);
    if (pSVar6 != this) {
      this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_01,"Instrument zone has already been owned by another instrument.");
      __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  return;
}

Assistant:

void SFInstrument::AddZone(SFInstrumentZone zone) {
  // Check the parent instrument of the zone.
  if (zone.has_parent_instrument()) {
    if (&zone.parent_instrument() == this) {
      // If the zone is already be owned by this instrument, do nothing.
      return;
    }
    else {
      // Otherwise raise an error. A zone cannot be shared by two parents.
      throw std::invalid_argument("Instrument zone has already been owned by another instrument.");
    }
  }

  // Set this instrument to the parent instrument of the zone.
  zone.set_parent_instrument(*this);

  // If the zone has an orphan sample, add it to the parent file.
  if (has_parent_file()) {
    if (zone.has_sample()) {
      parent_file().AddSample(zone.sample());
    }
  }

  // Add the zone to the list.
  zones_.push_back(std::make_unique<SFInstrumentZone>(std::move(zone)));
}